

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heter_queue_examples.cpp
# Opt level: O2

void density_tests::heterogeneous_queue_samples(ostream *i_ostream)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *this;
  ControlBlock *pCVar1;
  ControlBlock *pCVar2;
  bool bVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar4;
  long lVar5;
  runtime_type<> *prVar6;
  undefined8 *puVar7;
  ostream *poVar8;
  add_cv_qual_t<int,_(density::cv_qual)0> *paVar9;
  difference_type dVar10;
  difference_type dVar11;
  int *piVar12;
  long *plVar13;
  void *pvVar14;
  Allocation AVar15;
  heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> queue;
  string my_string;
  consume_operation consume;
  heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> queue_1;
  heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> queue_2;
  heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> queue_3;
  double pi;
  PrintScopeDuration dur;
  iterator local_268;
  iterator local_248;
  iterator local_228;
  iterator local_208;
  iterator local_1e8;
  iterator local_1c8;
  iterator local_1a8;
  iterator local_188;
  iterator local_168;
  iterator local_148;
  iterator local_128;
  iterator local_108;
  iterator local_e8;
  iterator local_c8;
  iterator local_a8;
  iterator local_88;
  iterator local_68;
  iterator local_48;
  
  my_string.field_2._M_allocated_capacity = my_string._M_string_length;
  PrintScopeDuration::PrintScopeDuration(&dur,i_ostream,"heterogeneous queue samples");
  queue.m_head = (ControlBlock *)0xffef;
  queue.m_tail = (ControlBlock *)0xffef;
  my_string._M_dataplus._M_p._0_4_ = 0x13;
  density::heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>>::
  emplace<int,int>((heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>> *
                   )&queue,(int *)&my_string);
  my_string._M_dataplus._M_p._0_4_ = 8;
  consume.m_queue =
       (heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)
       CONCAT71(consume.m_queue._1_7_,0x2a);
  density::heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>>::
  emplace<std::__cxx11::string,int,char>
            ((heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>> *)
             &queue,(int *)&my_string,(char *)&consume);
  consume.m_control =
       density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
       start_consume_impl(&queue);
  consume.m_queue = &queue;
  density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  consume_operation::element<int>(&consume);
  density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  consume_operation::commit(&consume);
  my_string._M_string_length =
       (size_type)
       density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
       start_consume_impl(&queue);
  my_string._M_dataplus._M_p = (pointer)&queue;
  density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  consume_operation::operator=(&consume,(consume_operation *)&my_string);
  density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  consume_operation::~consume_operation((consume_operation *)&my_string);
  pbVar4 = density::heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>>::
           consume_operation::element<std::__cxx11::string>((consume_operation *)&consume);
  std::__cxx11::string::string((string *)&my_string,(string *)pbVar4);
  density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  consume_operation::commit(&consume);
  std::__cxx11::string::~string((string *)&my_string);
  density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  consume_operation::~consume_operation(&consume);
  density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::destroy
            (&queue);
  queue_3.m_head = (ControlBlock *)0xffef;
  queue_3.m_tail = (ControlBlock *)0xffef;
  my_string._8_16_ =
       density::heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>>::
       inplace_allocate<0ul,true,8ul,8ul>
                 ((heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>> *)
                  &queue_3);
  plVar13 = my_string.field_2._0_8_;
  consume.m_control = my_string._M_string_length;
  consume.m_control[1].m_next =
       (uintptr_t)
       density::detail::
       FeatureTable<std::tuple<density::f_size,density::f_alignment,density::f_copy_construct,density::f_move_construct,density::f_rtti,density::f_destroy>,density_tests::heterogeneous_queue_samples(std::ostream&)::MessageInABottle>
       ::s_table;
  *plVar13 = 0;
  my_string._M_dataplus._M_p = (pointer)0x0;
  density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  put_transaction<MessageInABottle>::~put_transaction
            ((put_transaction<MessageInABottle> *)&my_string);
  queue.m_tail = consume.m_control;
  consume.m_queue =
       (heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)0x0;
  queue.m_head = (ControlBlock *)&queue_3;
  density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  put_transaction<MessageInABottle>::~put_transaction((put_transaction<MessageInABottle> *)&consume)
  ;
  AVar15 = density::heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>>::
           inplace_allocate<2ul,false>
                     ((heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>>
                       *)&queue_3,0xd,1);
  pvVar14 = AVar15.m_user_storage;
  for (lVar5 = 0; lVar5 != 0xd; lVar5 = lVar5 + 1) {
    *(char *)((long)pvVar14 + lVar5) = "Hello world!"[lVar5];
  }
  if (queue.m_head == (ControlBlock *)0x0) {
    detail::assert_failed<>
              ("!empty()",
               "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/include/density/heter_queue.h"
               ,0x2f7);
    *plVar13 = (long)pvVar14;
    detail::assert_failed<>
              ("!empty()",
               "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/include/density/heter_queue.h"
               ,0x2c2);
  }
  else {
    *plVar13 = (long)pvVar14;
  }
  queue.m_head = (ControlBlock *)0x0;
  consume.m_control =
       density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
       start_consume_impl(&queue_3);
  consume.m_queue = &queue_3;
  prVar6 = density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
           ::consume_operation::complete_type(&consume);
  if (prVar6->m_feature_table ==
      (tuple_type *)
      density::detail::
      FeatureTable<std::tuple<density::f_size,density::f_alignment,density::f_copy_construct,density::f_move_construct,density::f_rtti,density::f_destroy>,std::__cxx11::string>
      ::s_table) {
    pbVar4 = density::heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>>
             ::consume_operation::element<std::__cxx11::string>((consume_operation *)&consume);
    poVar8 = std::operator<<((ostream *)&std::cout,(string *)pbVar4);
  }
  else {
    prVar6 = density::
             heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
             consume_operation::complete_type(&consume);
    if (prVar6->m_feature_table !=
        (tuple_type *)
        density::detail::
        FeatureTable<std::tuple<density::f_size,density::f_alignment,density::f_copy_construct,density::f_move_construct,density::f_rtti,density::f_destroy>,density_tests::heterogeneous_queue_samples(std::ostream&)::MessageInABottle>
        ::s_table) goto LAB_00e889e4;
    if (consume.m_control == (ControlBlock *)0x0) {
LAB_00e88990:
      detail::assert_failed<>
                ("!empty() && complete_type().template is<COMPLETE_ELEMENT_TYPE>()",
                 "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/include/density/heter_queue.h"
                 ,0x415);
    }
    else {
      prVar6 = density::
               heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
               consume_operation::complete_type(&consume);
      if (prVar6->m_feature_table !=
          (tuple_type *)
          density::detail::
          FeatureTable<std::tuple<density::f_size,density::f_alignment,density::f_copy_construct,density::f_move_construct,density::f_rtti,density::f_destroy>,density_tests::heterogeneous_queue_samples(std::ostream&)::MessageInABottle>
          ::s_table) goto LAB_00e88990;
    }
    puVar7 = (undefined8 *)
             density::
             heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
             get_element(consume.m_control);
    poVar8 = std::operator<<((ostream *)&std::cout,(char *)*puVar7);
  }
  std::endl<char,std::char_traits<char>>(poVar8);
LAB_00e889e4:
  density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  consume_operation::commit(&consume);
  queue_1.m_head = (ControlBlock *)0xffef;
  queue_1.m_tail = (ControlBlock *)0xffef;
  queue_2.m_head = (ControlBlock *)0xffef;
  queue_2.m_tail = (ControlBlock *)0xffef;
  my_string._M_dataplus._M_p._0_4_ = 0x2a;
  density::heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>>::
  emplace<int,int>((heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>> *
                   )&queue_1,(int *)&my_string);
  density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::begin
            ((iterator *)&my_string,&queue_1);
  this = &my_string.field_2;
  while (my_string._M_dataplus._M_p != (pointer)0x0) {
    paVar9 = density::dynamic_reference<density::runtime_type<>,_(density::cv_qual)0>::as<int>
                       ((dynamic_reference<density::runtime_type<>,_(density::cv_qual)0> *)this);
    if (*paVar9 != 0x2a) {
      __assert_fail("value.as<int>() == 42",
                    "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/heter_queue_examples.cpp"
                    ,0x58f,"void density_tests::heterogeneous_queue_samples(std::ostream &)");
    }
    density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
    iterator::operator++((iterator *)&my_string);
  }
  density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::destroy
            (&queue_2);
  density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::destroy
            (&queue_1);
  density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  consume_operation::~consume_operation(&consume);
  density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  put_transaction<MessageInABottle>::~put_transaction((put_transaction<MessageInABottle> *)&queue);
  density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::destroy
            (&queue_3);
  queue.m_head = (ControlBlock *)0xffef;
  queue.m_tail = (ControlBlock *)0xffef;
  bVar3 = density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
          ::empty(&queue);
  if (!bVar3) {
    __assert_fail("queue.empty()",
                  "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/heter_queue_examples.cpp"
                  ,0x597,"void density_tests::heterogeneous_queue_samples(std::ostream &)");
  }
  density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::begin
            (&local_48,&queue);
  local_168.m_value.m_pair.m_address = (add_cv_qual_t<void,_(density::cv_qual)0> *)0x0;
  local_168.m_value.m_pair.m_type.m_feature_table = (runtime_type<>)(tuple_type *)0x0;
  local_168.m_control = (ControlBlock *)0x0;
  local_168.m_queue =
       (heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)0x0;
  dVar10 = std::
           distance<density::heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>>::iterator>
                     (&local_48,&local_168);
  if (dVar10 != 0) {
    __assert_fail("std::distance(queue.begin(), queue.end()) == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/heter_queue_examples.cpp"
                  ,0x598,"void density_tests::heterogeneous_queue_samples(std::ostream &)");
  }
  density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::cbegin
            ((const_iterator *)&my_string,&queue);
  if (my_string._M_dataplus._M_p != (pointer)0x0) {
    __assert_fail("queue.cbegin() == queue.cend()",
                  "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/heter_queue_examples.cpp"
                  ,0x599,"void density_tests::heterogeneous_queue_samples(std::ostream &)");
  }
  density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::destroy
            (&queue);
  queue.m_head = (ControlBlock *)0xffef;
  queue.m_tail = (ControlBlock *)0xffef;
  my_string._8_9_ = ZEXT89(0);
  my_string._M_dataplus._M_p = (pointer)this;
  density::
  heter_queue<density::runtime_type<density::f_default_construct,density::f_copy_construct,density::f_destroy,density::f_size,density::f_alignment,density::f_equal>,density::basic_default_allocator<65536ul>>
  ::emplace<std::__cxx11::string,std::__cxx11::string>
            ((heter_queue<density::runtime_type<density::f_default_construct,density::f_copy_construct,density::f_destroy,density::f_size,density::f_alignment,density::f_equal>,density::basic_default_allocator<65536ul>>
              *)&queue,&my_string);
  std::__cxx11::string::~string((string *)&my_string);
  my_string._M_dataplus._M_p = (pointer)0x4010000000000000;
  my_string._M_string_length._0_4_ = 1;
  density::
  heter_queue<density::runtime_type<density::f_default_construct,density::f_copy_construct,density::f_destroy,density::f_size,density::f_alignment,density::f_equal>,density::basic_default_allocator<65536ul>>
  ::emplace<std::pair<double,int>,std::pair<double,int>>
            ((heter_queue<density::runtime_type<density::f_default_construct,density::f_copy_construct,density::f_destroy,density::f_size,density::f_alignment,density::f_equal>,density::basic_default_allocator<65536ul>>
              *)&queue,(pair<double,_int> *)&my_string);
  density::
  heter_queue<density::runtime_type<density::f_default_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment,_density::f_equal>,_density::basic_default_allocator<65536UL>_>
  ::heter_queue((heter_queue<density::runtime_type<density::f_default_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment,_density::f_equal>,_density::basic_default_allocator<65536UL>_>
                 *)&my_string,
                (heter_queue<density::runtime_type<density::f_default_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment,_density::f_equal>,_density::basic_default_allocator<65536UL>_>
                 *)&queue);
  bVar3 = density::
          heter_queue<density::runtime_type<density::f_default_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment,_density::f_equal>,_density::basic_default_allocator<65536UL>_>
          ::operator==((heter_queue<density::runtime_type<density::f_default_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment,_density::f_equal>,_density::basic_default_allocator<65536UL>_>
                        *)&queue,
                       (heter_queue<density::runtime_type<density::f_default_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment,_density::f_equal>,_density::basic_default_allocator<65536UL>_>
                        *)&my_string);
  if (!bVar3) {
    __assert_fail("queue == queue_1",
                  "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/heter_queue_examples.cpp"
                  ,0x5ab,"void density_tests::heterogeneous_queue_samples(std::ostream &)");
  }
  density::
  heter_queue<density::runtime_type<density::f_default_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment,_density::f_equal>,_density::basic_default_allocator<65536UL>_>
  ::destroy((heter_queue<density::runtime_type<density::f_default_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment,_density::f_equal>,_density::basic_default_allocator<65536UL>_>
             *)&my_string);
  density::
  heter_queue<density::runtime_type<density::f_default_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment,_density::f_equal>,_density::basic_default_allocator<65536UL>_>
  ::destroy((heter_queue<density::runtime_type<density::f_default_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment,_density::f_equal>,_density::basic_default_allocator<65536UL>_>
             *)&queue);
  queue.m_head = (ControlBlock *)0xffef;
  queue.m_tail = (ControlBlock *)0xffef;
  my_string._8_9_ = ZEXT89(0);
  my_string._M_dataplus._M_p = (pointer)this;
  density::
  heter_queue<density::runtime_type<density::f_default_construct,density::f_copy_construct,density::f_destroy,density::f_size,density::f_alignment,density::f_equal>,density::basic_default_allocator<65536ul>>
  ::emplace<std::__cxx11::string,std::__cxx11::string>
            ((heter_queue<density::runtime_type<density::f_default_construct,density::f_copy_construct,density::f_destroy,density::f_size,density::f_alignment,density::f_equal>,density::basic_default_allocator<65536ul>>
              *)&queue,&my_string);
  std::__cxx11::string::~string((string *)&my_string);
  my_string._M_dataplus._M_p = (pointer)0x4010000000000000;
  my_string._M_string_length._0_4_ = 1;
  density::
  heter_queue<density::runtime_type<density::f_default_construct,density::f_copy_construct,density::f_destroy,density::f_size,density::f_alignment,density::f_equal>,density::basic_default_allocator<65536ul>>
  ::emplace<std::pair<double,int>,std::pair<double,int>>
            ((heter_queue<density::runtime_type<density::f_default_construct,density::f_copy_construct,density::f_destroy,density::f_size,density::f_alignment,density::f_equal>,density::basic_default_allocator<65536ul>>
              *)&queue,(pair<double,_int> *)&my_string);
  consume.m_queue =
       (heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)
       queue.m_head;
  consume.m_control = queue.m_tail;
  queue.m_head = (ControlBlock *)0xffef;
  queue.m_tail = (ControlBlock *)0xffef;
  bVar3 = density::
          heter_queue<density::runtime_type<density::f_default_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment,_density::f_equal>,_density::basic_default_allocator<65536UL>_>
          ::empty((heter_queue<density::runtime_type<density::f_default_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment,_density::f_equal>,_density::basic_default_allocator<65536UL>_>
                   *)&queue);
  if (!bVar3) {
    __assert_fail("queue.empty()",
                  "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/heter_queue_examples.cpp"
                  ,0x5be,"void density_tests::heterogeneous_queue_samples(std::ostream &)");
  }
  density::
  heter_queue<density::runtime_type<density::f_default_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment,_density::f_equal>,_density::basic_default_allocator<65536UL>_>
  ::begin(&local_68,
          (heter_queue<density::runtime_type<density::f_default_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment,_density::f_equal>,_density::basic_default_allocator<65536UL>_>
           *)&queue);
  local_188.m_value.m_pair.m_address = (add_cv_qual_t<void,_(density::cv_qual)0> *)0x0;
  local_188.m_value.m_pair.m_type.m_feature_table =
       (runtime_type<density::f_default_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment,_density::f_equal>
        )(tuple_type *)0x0;
  local_188.m_control = (ControlBlock *)0x0;
  local_188.m_queue =
       (heter_queue<density::runtime_type<density::f_default_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment,_density::f_equal>,_density::basic_default_allocator<65536UL>_>
        *)0x0;
  dVar11 = std::
           distance<density::heter_queue<density::runtime_type<density::f_default_construct,density::f_copy_construct,density::f_destroy,density::f_size,density::f_alignment,density::f_equal>,density::basic_default_allocator<65536ul>>::iterator>
                     (&local_68,&local_188);
  if (dVar11 != 0) {
    __assert_fail("std::distance(queue.begin(), queue.end()) == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/heter_queue_examples.cpp"
                  ,0x5bf,"void density_tests::heterogeneous_queue_samples(std::ostream &)");
  }
  density::
  heter_queue<density::runtime_type<density::f_default_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment,_density::f_equal>,_density::basic_default_allocator<65536UL>_>
  ::cbegin((const_iterator *)&my_string,
           (heter_queue<density::runtime_type<density::f_default_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment,_density::f_equal>,_density::basic_default_allocator<65536UL>_>
            *)&queue);
  if (my_string._M_dataplus._M_p != (pointer)0x0) {
    __assert_fail("queue.cbegin() == queue.cend()",
                  "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/heter_queue_examples.cpp"
                  ,0x5c0,"void density_tests::heterogeneous_queue_samples(std::ostream &)");
  }
  bVar3 = density::
          heter_queue<density::runtime_type<density::f_default_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment,_density::f_equal>,_density::basic_default_allocator<65536UL>_>
          ::empty((heter_queue<density::runtime_type<density::f_default_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment,_density::f_equal>,_density::basic_default_allocator<65536UL>_>
                   *)&consume);
  if (bVar3) {
    __assert_fail("!queue_1.empty()",
                  "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/heter_queue_examples.cpp"
                  ,0x5c2,"void density_tests::heterogeneous_queue_samples(std::ostream &)");
  }
  density::
  heter_queue<density::runtime_type<density::f_default_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment,_density::f_equal>,_density::basic_default_allocator<65536UL>_>
  ::begin(&local_88,
          (heter_queue<density::runtime_type<density::f_default_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment,_density::f_equal>,_density::basic_default_allocator<65536UL>_>
           *)&consume);
  local_1a8.m_value.m_pair.m_address = (add_cv_qual_t<void,_(density::cv_qual)0> *)0x0;
  local_1a8.m_value.m_pair.m_type.m_feature_table =
       (runtime_type<density::f_default_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment,_density::f_equal>
        )(tuple_type *)0x0;
  local_1a8.m_control = (ControlBlock *)0x0;
  local_1a8.m_queue =
       (heter_queue<density::runtime_type<density::f_default_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment,_density::f_equal>,_density::basic_default_allocator<65536UL>_>
        *)0x0;
  dVar11 = std::
           distance<density::heter_queue<density::runtime_type<density::f_default_construct,density::f_copy_construct,density::f_destroy,density::f_size,density::f_alignment,density::f_equal>,density::basic_default_allocator<65536ul>>::iterator>
                     (&local_88,&local_1a8);
  if (dVar11 != 2) {
    __assert_fail("std::distance(queue_1.begin(), queue_1.end()) == 2",
                  "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/heter_queue_examples.cpp"
                  ,0x5c3,"void density_tests::heterogeneous_queue_samples(std::ostream &)");
  }
  density::
  heter_queue<density::runtime_type<density::f_default_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment,_density::f_equal>,_density::basic_default_allocator<65536UL>_>
  ::cbegin((const_iterator *)&my_string,
           (heter_queue<density::runtime_type<density::f_default_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment,_density::f_equal>,_density::basic_default_allocator<65536UL>_>
            *)&consume);
  if (my_string._M_dataplus._M_p == (pointer)0x0) {
    __assert_fail("queue_1.cbegin() != queue_1.cend()",
                  "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/heter_queue_examples.cpp"
                  ,0x5c4,"void density_tests::heterogeneous_queue_samples(std::ostream &)");
  }
  density::
  heter_queue<density::runtime_type<density::f_default_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment,_density::f_equal>,_density::basic_default_allocator<65536UL>_>
  ::destroy((heter_queue<density::runtime_type<density::f_default_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment,_density::f_equal>,_density::basic_default_allocator<65536UL>_>
             *)&consume);
  density::
  heter_queue<density::runtime_type<density::f_default_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment,_density::f_equal>,_density::basic_default_allocator<65536UL>_>
  ::destroy((heter_queue<density::runtime_type<density::f_default_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment,_density::f_equal>,_density::basic_default_allocator<65536UL>_>
             *)&queue);
  my_string._M_dataplus._M_p = (pointer)0xffef;
  my_string._M_string_length = 0xffef;
  bVar3 = density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
          ::empty((heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
                   *)&my_string);
  if (!bVar3) {
    __assert_fail("queue.empty()",
                  "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/heter_queue_examples.cpp"
                  ,0x5cb,"void density_tests::heterogeneous_queue_samples(std::ostream &)");
  }
  density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::destroy
            ((heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)
             &my_string);
  my_string._M_dataplus._M_p = (pointer)0xffef;
  my_string._M_string_length = 0xffef;
  bVar3 = density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
          ::empty((heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
                   *)&my_string);
  if (!bVar3) {
    __assert_fail("queue.empty()",
                  "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/heter_queue_examples.cpp"
                  ,0x5d2,"void density_tests::heterogeneous_queue_samples(std::ostream &)");
  }
  density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::destroy
            ((heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)
             &my_string);
  queue.m_head = (ControlBlock *)0xffef;
  queue.m_tail = (ControlBlock *)0xffef;
  my_string._8_9_ = ZEXT89(0);
  my_string._M_dataplus._M_p = (pointer)this;
  density::
  heter_queue<density::runtime_type<density::f_default_construct,density::f_copy_construct,density::f_destroy,density::f_size,density::f_alignment,density::f_equal>,density::basic_default_allocator<65536ul>>
  ::emplace<std::__cxx11::string,std::__cxx11::string>
            ((heter_queue<density::runtime_type<density::f_default_construct,density::f_copy_construct,density::f_destroy,density::f_size,density::f_alignment,density::f_equal>,density::basic_default_allocator<65536ul>>
              *)&queue,&my_string);
  std::__cxx11::string::~string((string *)&my_string);
  my_string._M_dataplus._M_p = (pointer)0x4010000000000000;
  my_string._M_string_length._0_4_ = 1;
  density::
  heter_queue<density::runtime_type<density::f_default_construct,density::f_copy_construct,density::f_destroy,density::f_size,density::f_alignment,density::f_equal>,density::basic_default_allocator<65536ul>>
  ::emplace<std::pair<double,int>,std::pair<double,int>>
            ((heter_queue<density::runtime_type<density::f_default_construct,density::f_copy_construct,density::f_destroy,density::f_size,density::f_alignment,density::f_equal>,density::basic_default_allocator<65536ul>>
              *)&queue,(pair<double,_int> *)&my_string);
  my_string._M_dataplus._M_p = (pointer)0xffef;
  my_string._M_string_length = 0xffef;
  density::
  heter_queue<density::runtime_type<density::f_default_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment,_density::f_equal>,_density::basic_default_allocator<65536UL>_>
  ::operator=((heter_queue<density::runtime_type<density::f_default_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment,_density::f_equal>,_density::basic_default_allocator<65536UL>_>
               *)&my_string,
              (heter_queue<density::runtime_type<density::f_default_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment,_density::f_equal>,_density::basic_default_allocator<65536UL>_>
               *)&queue);
  bVar3 = density::
          heter_queue<density::runtime_type<density::f_default_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment,_density::f_equal>,_density::basic_default_allocator<65536UL>_>
          ::operator==((heter_queue<density::runtime_type<density::f_default_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment,_density::f_equal>,_density::basic_default_allocator<65536UL>_>
                        *)&queue,
                       (heter_queue<density::runtime_type<density::f_default_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment,_density::f_equal>,_density::basic_default_allocator<65536UL>_>
                        *)&my_string);
  if (!bVar3) {
    __assert_fail("queue == queue_1",
                  "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/heter_queue_examples.cpp"
                  ,0x5e5,"void density_tests::heterogeneous_queue_samples(std::ostream &)");
  }
  density::
  heter_queue<density::runtime_type<density::f_default_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment,_density::f_equal>,_density::basic_default_allocator<65536UL>_>
  ::destroy((heter_queue<density::runtime_type<density::f_default_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment,_density::f_equal>,_density::basic_default_allocator<65536UL>_>
             *)&my_string);
  density::
  heter_queue<density::runtime_type<density::f_default_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment,_density::f_equal>,_density::basic_default_allocator<65536UL>_>
  ::destroy((heter_queue<density::runtime_type<density::f_default_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment,_density::f_equal>,_density::basic_default_allocator<65536UL>_>
             *)&queue);
  queue.m_head = (ControlBlock *)0xffef;
  queue.m_tail = (ControlBlock *)0xffef;
  my_string._8_9_ = ZEXT89(0);
  my_string._M_dataplus._M_p = (pointer)this;
  density::
  heter_queue<density::runtime_type<density::f_default_construct,density::f_copy_construct,density::f_destroy,density::f_size,density::f_alignment,density::f_equal>,density::basic_default_allocator<65536ul>>
  ::emplace<std::__cxx11::string,std::__cxx11::string>
            ((heter_queue<density::runtime_type<density::f_default_construct,density::f_copy_construct,density::f_destroy,density::f_size,density::f_alignment,density::f_equal>,density::basic_default_allocator<65536ul>>
              *)&queue,&my_string);
  std::__cxx11::string::~string((string *)&my_string);
  my_string._M_dataplus._M_p = (pointer)0x4010000000000000;
  my_string._M_string_length._0_4_ = 1;
  density::
  heter_queue<density::runtime_type<density::f_default_construct,density::f_copy_construct,density::f_destroy,density::f_size,density::f_alignment,density::f_equal>,density::basic_default_allocator<65536ul>>
  ::emplace<std::pair<double,int>,std::pair<double,int>>
            ((heter_queue<density::runtime_type<density::f_default_construct,density::f_copy_construct,density::f_destroy,density::f_size,density::f_alignment,density::f_equal>,density::basic_default_allocator<65536ul>>
              *)&queue,(pair<double,_int> *)&my_string);
  consume.m_queue =
       (heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)0xffef;
  consume.m_control = (ControlBlock *)0xffef;
  density::
  heter_queue<density::runtime_type<density::f_default_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment,_density::f_equal>,_density::basic_default_allocator<65536UL>_>
  ::operator=((heter_queue<density::runtime_type<density::f_default_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment,_density::f_equal>,_density::basic_default_allocator<65536UL>_>
               *)&consume,
              (heter_queue<density::runtime_type<density::f_default_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment,_density::f_equal>,_density::basic_default_allocator<65536UL>_>
               *)&queue);
  bVar3 = density::
          heter_queue<density::runtime_type<density::f_default_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment,_density::f_equal>,_density::basic_default_allocator<65536UL>_>
          ::empty((heter_queue<density::runtime_type<density::f_default_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment,_density::f_equal>,_density::basic_default_allocator<65536UL>_>
                   *)&queue);
  if (!bVar3) {
    __assert_fail("queue.empty()",
                  "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/heter_queue_examples.cpp"
                  ,0x5f9,"void density_tests::heterogeneous_queue_samples(std::ostream &)");
  }
  density::
  heter_queue<density::runtime_type<density::f_default_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment,_density::f_equal>,_density::basic_default_allocator<65536UL>_>
  ::begin(&local_a8,
          (heter_queue<density::runtime_type<density::f_default_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment,_density::f_equal>,_density::basic_default_allocator<65536UL>_>
           *)&queue);
  local_1c8.m_value.m_pair.m_address = (add_cv_qual_t<void,_(density::cv_qual)0> *)0x0;
  local_1c8.m_value.m_pair.m_type.m_feature_table =
       (runtime_type<density::f_default_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment,_density::f_equal>
        )(tuple_type *)0x0;
  local_1c8.m_control = (ControlBlock *)0x0;
  local_1c8.m_queue =
       (heter_queue<density::runtime_type<density::f_default_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment,_density::f_equal>,_density::basic_default_allocator<65536UL>_>
        *)0x0;
  dVar11 = std::
           distance<density::heter_queue<density::runtime_type<density::f_default_construct,density::f_copy_construct,density::f_destroy,density::f_size,density::f_alignment,density::f_equal>,density::basic_default_allocator<65536ul>>::iterator>
                     (&local_a8,&local_1c8);
  if (dVar11 != 0) {
    __assert_fail("std::distance(queue.begin(), queue.end()) == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/heter_queue_examples.cpp"
                  ,0x5fa,"void density_tests::heterogeneous_queue_samples(std::ostream &)");
  }
  density::
  heter_queue<density::runtime_type<density::f_default_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment,_density::f_equal>,_density::basic_default_allocator<65536UL>_>
  ::cbegin((const_iterator *)&my_string,
           (heter_queue<density::runtime_type<density::f_default_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment,_density::f_equal>,_density::basic_default_allocator<65536UL>_>
            *)&queue);
  if (my_string._M_dataplus._M_p != (pointer)0x0) {
    __assert_fail("queue.cbegin() == queue.cend()",
                  "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/heter_queue_examples.cpp"
                  ,0x5fb,"void density_tests::heterogeneous_queue_samples(std::ostream &)");
  }
  bVar3 = density::
          heter_queue<density::runtime_type<density::f_default_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment,_density::f_equal>,_density::basic_default_allocator<65536UL>_>
          ::empty((heter_queue<density::runtime_type<density::f_default_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment,_density::f_equal>,_density::basic_default_allocator<65536UL>_>
                   *)&consume);
  if (bVar3) {
    __assert_fail("!queue_1.empty()",
                  "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/heter_queue_examples.cpp"
                  ,0x5fd,"void density_tests::heterogeneous_queue_samples(std::ostream &)");
  }
  density::
  heter_queue<density::runtime_type<density::f_default_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment,_density::f_equal>,_density::basic_default_allocator<65536UL>_>
  ::begin(&local_c8,
          (heter_queue<density::runtime_type<density::f_default_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment,_density::f_equal>,_density::basic_default_allocator<65536UL>_>
           *)&consume);
  local_1e8.m_value.m_pair.m_address = (add_cv_qual_t<void,_(density::cv_qual)0> *)0x0;
  local_1e8.m_value.m_pair.m_type.m_feature_table =
       (runtime_type<density::f_default_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment,_density::f_equal>
        )(tuple_type *)0x0;
  local_1e8.m_control = (ControlBlock *)0x0;
  local_1e8.m_queue =
       (heter_queue<density::runtime_type<density::f_default_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment,_density::f_equal>,_density::basic_default_allocator<65536UL>_>
        *)0x0;
  dVar11 = std::
           distance<density::heter_queue<density::runtime_type<density::f_default_construct,density::f_copy_construct,density::f_destroy,density::f_size,density::f_alignment,density::f_equal>,density::basic_default_allocator<65536ul>>::iterator>
                     (&local_c8,&local_1e8);
  if (dVar11 != 2) {
    __assert_fail("std::distance(queue_1.begin(), queue_1.end()) == 2",
                  "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/heter_queue_examples.cpp"
                  ,0x5fe,"void density_tests::heterogeneous_queue_samples(std::ostream &)");
  }
  density::
  heter_queue<density::runtime_type<density::f_default_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment,_density::f_equal>,_density::basic_default_allocator<65536UL>_>
  ::cbegin((const_iterator *)&my_string,
           (heter_queue<density::runtime_type<density::f_default_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment,_density::f_equal>,_density::basic_default_allocator<65536UL>_>
            *)&consume);
  if (my_string._M_dataplus._M_p == (pointer)0x0) {
    __assert_fail("queue_1.cbegin() != queue_1.cend()",
                  "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/heter_queue_examples.cpp"
                  ,0x5ff,"void density_tests::heterogeneous_queue_samples(std::ostream &)");
  }
  density::
  heter_queue<density::runtime_type<density::f_default_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment,_density::f_equal>,_density::basic_default_allocator<65536UL>_>
  ::destroy((heter_queue<density::runtime_type<density::f_default_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment,_density::f_equal>,_density::basic_default_allocator<65536UL>_>
             *)&consume);
  density::
  heter_queue<density::runtime_type<density::f_default_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment,_density::f_equal>,_density::basic_default_allocator<65536UL>_>
  ::destroy((heter_queue<density::runtime_type<density::f_default_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment,_density::f_equal>,_density::basic_default_allocator<65536UL>_>
             *)&queue);
  my_string._M_dataplus._M_p = (pointer)0xffef;
  my_string._M_string_length = 0xffef;
  density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::destroy
            ((heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)
             &my_string);
  my_string._M_dataplus._M_p = (pointer)0xffef;
  my_string._M_string_length = 0xffef;
  density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::destroy
            ((heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)
             &my_string);
  my_string._M_dataplus._M_p = (pointer)0xffef;
  my_string._M_string_length = 0xffef;
  density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::destroy
            ((heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)
             &my_string);
  queue.m_head = (ControlBlock *)0xffef;
  queue.m_tail = (ControlBlock *)0xffef;
  consume.m_queue =
       (heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)0xffef;
  consume.m_control = (ControlBlock *)0xffef;
  my_string._M_dataplus._M_p._0_4_ = 1;
  density::heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>>::
  emplace<int,int>((heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>> *
                   )&queue,(int *)&my_string);
  pCVar2 = queue.m_tail;
  pCVar1 = queue.m_head;
  queue.m_head = (ControlBlock *)consume.m_queue;
  queue.m_tail = consume.m_control;
  consume.m_queue =
       (heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)pCVar1;
  consume.m_control = pCVar2;
  bVar3 = density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
          ::empty(&queue);
  if (!bVar3) {
    __assert_fail("queue.empty()",
                  "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/heter_queue_examples.cpp"
                  ,0x61c,"void density_tests::heterogeneous_queue_samples(std::ostream &)");
  }
  density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::begin
            (&local_e8,&queue);
  local_208.m_value.m_pair.m_address = (add_cv_qual_t<void,_(density::cv_qual)0> *)0x0;
  local_208.m_value.m_pair.m_type.m_feature_table = (runtime_type<>)(tuple_type *)0x0;
  local_208.m_control = (ControlBlock *)0x0;
  local_208.m_queue =
       (heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)0x0;
  dVar10 = std::
           distance<density::heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>>::iterator>
                     (&local_e8,&local_208);
  if (dVar10 != 0) {
    __assert_fail("std::distance(queue.begin(), queue.end()) == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/heter_queue_examples.cpp"
                  ,0x61d,"void density_tests::heterogeneous_queue_samples(std::ostream &)");
  }
  density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::cbegin
            ((const_iterator *)&my_string,&queue);
  if (my_string._M_dataplus._M_p != (pointer)0x0) {
    __assert_fail("queue.cbegin() == queue.cend()",
                  "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/heter_queue_examples.cpp"
                  ,0x61e,"void density_tests::heterogeneous_queue_samples(std::ostream &)");
  }
  bVar3 = density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
          ::empty((heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
                   *)&consume);
  if (bVar3) {
    __assert_fail("!queue_1.empty()",
                  "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/heter_queue_examples.cpp"
                  ,0x620,"void density_tests::heterogeneous_queue_samples(std::ostream &)");
  }
  density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::begin
            (&local_108,
             (heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)
             &consume);
  local_228.m_value.m_pair.m_address = (add_cv_qual_t<void,_(density::cv_qual)0> *)0x0;
  local_228.m_value.m_pair.m_type.m_feature_table = (runtime_type<>)(tuple_type *)0x0;
  local_228.m_control = (ControlBlock *)0x0;
  local_228.m_queue =
       (heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)0x0;
  dVar10 = std::
           distance<density::heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>>::iterator>
                     (&local_108,&local_228);
  if (dVar10 != 1) {
    __assert_fail("std::distance(queue_1.begin(), queue_1.end()) == 1",
                  "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/heter_queue_examples.cpp"
                  ,0x621,"void density_tests::heterogeneous_queue_samples(std::ostream &)");
  }
  density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::cbegin
            ((const_iterator *)&my_string,
             (heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)
             &consume);
  if (my_string._M_dataplus._M_p == (pointer)0x0) {
    __assert_fail("queue_1.cbegin() != queue_1.cend()",
                  "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/heter_queue_examples.cpp"
                  ,0x622,"void density_tests::heterogeneous_queue_samples(std::ostream &)");
  }
  density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::destroy
            ((heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)
             &consume);
  density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::destroy
            (&queue);
  queue.m_head = (ControlBlock *)0xffef;
  queue.m_tail = (ControlBlock *)0xffef;
  consume.m_queue =
       (heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)0xffef;
  consume.m_control = (ControlBlock *)0xffef;
  my_string._M_dataplus._M_p._0_4_ = 1;
  density::heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>>::
  emplace<int,int>((heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>> *
                   )&queue,(int *)&my_string);
  pCVar2 = queue.m_tail;
  pCVar1 = queue.m_head;
  queue.m_head = (ControlBlock *)consume.m_queue;
  queue.m_tail = consume.m_control;
  consume.m_queue =
       (heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)pCVar1;
  consume.m_control = pCVar2;
  bVar3 = density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
          ::empty(&queue);
  if (!bVar3) {
    __assert_fail("queue.empty()",
                  "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/heter_queue_examples.cpp"
                  ,0x62d,"void density_tests::heterogeneous_queue_samples(std::ostream &)");
  }
  density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::begin
            (&local_128,&queue);
  local_248.m_value.m_pair.m_address = (add_cv_qual_t<void,_(density::cv_qual)0> *)0x0;
  local_248.m_value.m_pair.m_type.m_feature_table = (runtime_type<>)(tuple_type *)0x0;
  local_248.m_control = (ControlBlock *)0x0;
  local_248.m_queue =
       (heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)0x0;
  dVar10 = std::
           distance<density::heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>>::iterator>
                     (&local_128,&local_248);
  if (dVar10 != 0) {
    __assert_fail("std::distance(queue.begin(), queue.end()) == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/heter_queue_examples.cpp"
                  ,0x62e,"void density_tests::heterogeneous_queue_samples(std::ostream &)");
  }
  density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::cbegin
            ((const_iterator *)&my_string,&queue);
  if (my_string._M_dataplus._M_p != (pointer)0x0) {
    __assert_fail("queue.cbegin() == queue.cend()",
                  "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/heter_queue_examples.cpp"
                  ,0x62f,"void density_tests::heterogeneous_queue_samples(std::ostream &)");
  }
  bVar3 = density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
          ::empty((heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
                   *)&consume);
  if (bVar3) {
    __assert_fail("!queue_1.empty()",
                  "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/heter_queue_examples.cpp"
                  ,0x631,"void density_tests::heterogeneous_queue_samples(std::ostream &)");
  }
  density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::begin
            (&local_148,
             (heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)
             &consume);
  local_268.m_value.m_pair.m_address = (add_cv_qual_t<void,_(density::cv_qual)0> *)0x0;
  local_268.m_value.m_pair.m_type.m_feature_table = (runtime_type<>)(tuple_type *)0x0;
  local_268.m_control = (ControlBlock *)0x0;
  local_268.m_queue =
       (heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)0x0;
  dVar10 = std::
           distance<density::heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>>::iterator>
                     (&local_148,&local_268);
  if (dVar10 == 1) {
    density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
    cbegin((const_iterator *)&my_string,
           (heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)
           &consume);
    if (my_string._M_dataplus._M_p == (pointer)0x0) {
      __assert_fail("queue_1.cbegin() != queue_1.cend()",
                    "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/heter_queue_examples.cpp"
                    ,0x633,"void density_tests::heterogeneous_queue_samples(std::ostream &)");
    }
    density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
    destroy((heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)
            &consume);
    density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
    destroy(&queue);
    my_string._M_dataplus._M_p = (pointer)0xffef;
    my_string._M_string_length = 0xffef;
    bVar3 = density::
            heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::empty
                      ((heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
                        *)&my_string);
    if (!bVar3) {
      __assert_fail("queue.empty()",
                    "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/heter_queue_examples.cpp"
                    ,0x639,"void density_tests::heterogeneous_queue_samples(std::ostream &)");
    }
    queue.m_head = (ControlBlock *)CONCAT44(queue.m_head._4_4_,1);
    density::heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>>::
    emplace<int,int>((heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>>
                      *)&my_string,(int *)&queue);
    bVar3 = density::
            heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::empty
                      ((heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
                        *)&my_string);
    if (bVar3) {
      __assert_fail("!queue.empty()",
                    "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/heter_queue_examples.cpp"
                    ,0x63b,"void density_tests::heterogeneous_queue_samples(std::ostream &)");
    }
    density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
    destroy((heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)
            &my_string);
    my_string._M_dataplus._M_p = (pointer)0xffef;
    my_string._M_string_length = 0xffef;
    queue.m_head = (ControlBlock *)CONCAT44(queue.m_head._4_4_,1);
    density::heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>>::
    emplace<int,int>((heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>>
                      *)&my_string,(int *)&queue);
    density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::clear
              ((heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)
               &my_string);
    bVar3 = density::
            heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::empty
                      ((heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
                        *)&my_string);
    if (!bVar3) {
      __assert_fail("queue.empty()",
                    "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/heter_queue_examples.cpp"
                    ,0x643,"void density_tests::heterogeneous_queue_samples(std::ostream &)");
    }
    density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
    destroy((heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)
            &my_string);
    my_string._M_dataplus._M_p = (pointer)0xffef;
    my_string._M_string_length = 0xffef;
    queue.m_head = (ControlBlock *)CONCAT44(queue.m_head._4_4_,1);
    density::heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>>::
    emplace<int,int>((heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>>
                      *)&my_string,(int *)&queue);
    queue.m_head = (ControlBlock *)CONCAT44(queue.m_head._4_4_,2);
    density::heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>>::
    emplace<int,int>((heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>>
                      *)&my_string,(int *)&queue);
    density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::pop
              ((heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)
               &my_string);
    queue.m_tail = density::
                   heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
                   ::start_consume_impl
                             ((heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
                               *)&my_string);
    queue.m_head = (ControlBlock *)&my_string;
    piVar12 = density::
              heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
              consume_operation::element<int>((consume_operation *)&queue);
    if (*piVar12 != 2) {
      __assert_fail("consume.element<int>() == 2",
                    "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/heter_queue_examples.cpp"
                    ,0x64e,"void density_tests::heterogeneous_queue_samples(std::ostream &)");
    }
    density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
    consume_operation::commit((consume_operation *)&queue);
    density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
    consume_operation::~consume_operation((consume_operation *)&queue);
    density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
    destroy((heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)
            &my_string);
    my_string._M_dataplus._M_p = (pointer)0xffef;
    my_string._M_string_length = 0xffef;
    bVar3 = density::
            heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
            try_pop((heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
                     *)&my_string);
    if (bVar3) {
      __assert_fail("pop_result == false",
                    "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/heter_queue_examples.cpp"
                    ,0x657,"void density_tests::heterogeneous_queue_samples(std::ostream &)");
    }
    queue.m_head = (ControlBlock *)CONCAT44(queue.m_head._4_4_,1);
    density::heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>>::
    emplace<int,int>((heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>>
                      *)&my_string,(int *)&queue);
    queue.m_head = (ControlBlock *)CONCAT44(queue.m_head._4_4_,2);
    density::heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>>::
    emplace<int,int>((heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>>
                      *)&my_string,(int *)&queue);
    bVar3 = density::
            heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
            try_pop((heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
                     *)&my_string);
    if (!bVar3) {
      __assert_fail("pop_result == true",
                    "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/heter_queue_examples.cpp"
                    ,0x65d,"void density_tests::heterogeneous_queue_samples(std::ostream &)");
    }
    queue.m_tail = density::
                   heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
                   ::start_consume_impl
                             ((heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
                               *)&my_string);
    queue.m_head = (ControlBlock *)&my_string;
    piVar12 = density::
              heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
              consume_operation::element<int>((consume_operation *)&queue);
    if (*piVar12 != 2) {
      __assert_fail("consume.element<int>() == 2",
                    "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/heter_queue_examples.cpp"
                    ,0x65f,"void density_tests::heterogeneous_queue_samples(std::ostream &)");
    }
    density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
    consume_operation::commit((consume_operation *)&queue);
    density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
    consume_operation::~consume_operation((consume_operation *)&queue);
    density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
    destroy((heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)
            &my_string);
    my_string._M_dataplus._M_p = (pointer)0xffef;
    my_string._M_string_length = 0xffef;
    queue.m_tail = density::
                   heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
                   ::start_consume_impl
                             ((heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
                               *)&my_string);
    queue.m_head = (ControlBlock *)&my_string;
    if (queue.m_tail != (ControlBlock *)0x0) {
      __assert_fail("!consume_1",
                    "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/heter_queue_examples.cpp"
                    ,0x669,"void density_tests::heterogeneous_queue_samples(std::ostream &)");
    }
    consume.m_queue =
         (heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)
         CONCAT44(consume.m_queue._4_4_,0x2a);
    density::heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>>::
    emplace<int,int>((heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>>
                      *)&my_string,(int *)&consume);
    consume.m_control =
         density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
         start_consume_impl((heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
                             *)&my_string);
    consume.m_queue =
         (heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)
         &my_string;
    if (consume.m_control == (ControlBlock *)0x0) {
      __assert_fail("consume_2",
                    "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/heter_queue_examples.cpp"
                    ,0x66e,"void density_tests::heterogeneous_queue_samples(std::ostream &)");
    }
    piVar12 = density::
              heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
              consume_operation::element<int>(&consume);
    if (*piVar12 != 0x2a) {
      __assert_fail("consume_2.element<int>() == 42",
                    "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/heter_queue_examples.cpp"
                    ,0x66f,"void density_tests::heterogeneous_queue_samples(std::ostream &)");
    }
    density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
    consume_operation::commit(&consume);
    density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
    consume_operation::~consume_operation(&consume);
    density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
    consume_operation::~consume_operation((consume_operation *)&queue);
    density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
    destroy((heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)
            &my_string);
    my_string._M_dataplus._M_p = (pointer)0xffef;
    my_string._M_string_length = 0xffef;
    queue.m_tail = (ControlBlock *)0x0;
    bVar3 = density::
            heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
            try_start_consume((heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
                               *)&my_string,(consume_operation *)&queue);
    if ((bVar3) || (queue.m_tail != (ControlBlock *)0x0)) {
      __assert_fail("!bool_1 && !consume_1",
                    "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/heter_queue_examples.cpp"
                    ,0x679,"void density_tests::heterogeneous_queue_samples(std::ostream &)");
    }
    consume.m_queue =
         (heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)
         CONCAT44(consume.m_queue._4_4_,0x2a);
    density::heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>>::
    emplace<int,int>((heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>>
                      *)&my_string,(int *)&consume);
    consume.m_control = (ControlBlock *)0x0;
    bVar3 = density::
            heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
            try_start_consume((heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
                               *)&my_string,&consume);
    if ((!bVar3) || (consume.m_control == (ControlBlock *)0x0)) {
      __assert_fail("consume_2 && bool_2",
                    "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/heter_queue_examples.cpp"
                    ,0x67f,"void density_tests::heterogeneous_queue_samples(std::ostream &)");
    }
    piVar12 = density::
              heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
              consume_operation::element<int>(&consume);
    if (*piVar12 != 0x2a) {
      __assert_fail("consume_2.element<int>() == 42",
                    "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/heter_queue_examples.cpp"
                    ,0x680,"void density_tests::heterogeneous_queue_samples(std::ostream &)");
    }
    density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
    consume_operation::commit(&consume);
    density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
    consume_operation::~consume_operation(&consume);
    density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
    consume_operation::~consume_operation((consume_operation *)&queue);
    density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
    destroy((heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)
            &my_string);
    queue_1.m_head = (ControlBlock *)0xffef;
    queue_1.m_tail = (ControlBlock *)0xffef;
    consume.m_queue =
         (heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)
         CONCAT44(consume.m_queue._4_4_,1);
    density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
    start_reentrant_push<int>((reentrant_put_transaction<int> *)&queue,&queue_1,(int *)&consume);
    my_string._M_dataplus._M_p = (pointer)queue.m_head;
    my_string._M_string_length = (size_type)queue.m_tail;
    queue.m_head = (ControlBlock *)0x0;
    my_string.field_2._M_allocated_capacity = (size_type)plVar13;
    density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
    reentrant_put_transaction<int>::~reentrant_put_transaction
              ((reentrant_put_transaction<int> *)&queue);
    density::heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>>::
    start_reentrant_emplace<std::__cxx11::string,char_const(&)[13]>
              ((reentrant_put_transaction<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)&consume,
               (heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>> *)
               &queue_1,(char (*) [13])"Hello world!");
    queue.m_head = (ControlBlock *)consume.m_queue;
    queue.m_tail = consume.m_control;
    consume.m_queue =
         (heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)0x0;
    density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
    reentrant_put_transaction<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~reentrant_put_transaction
              ((reentrant_put_transaction<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)&consume);
    pi = 3.14;
    queue_2.m_head =
         (ControlBlock *)
         density::detail::
         FeatureTable<std::tuple<density::f_size,density::f_alignment,density::f_copy_construct,density::f_move_construct,density::f_rtti,density::f_destroy>,double>
         ::s_table;
    density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
    start_reentrant_dyn_push_copy
              ((reentrant_put_transaction<void> *)&queue_3,&queue_1,(runtime_type<> *)&queue_2,&pi);
    consume.m_queue =
         (heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)
         queue_3.m_head;
    consume.m_control = queue_3.m_tail;
    queue_3.m_head = (ControlBlock *)0x0;
    density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
    reentrant_put_transaction<void>::~reentrant_put_transaction
              ((reentrant_put_transaction<void> *)&queue_3);
    bVar3 = density::
            heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::empty
                      (&queue_1);
    if (!bVar3) {
      __assert_fail("queue.empty()",
                    "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/heter_queue_examples.cpp"
                    ,0x690,"void density_tests::heterogeneous_queue_samples(std::ostream &)");
    }
    density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
    reentrant_put_transaction<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::commit((reentrant_put_transaction<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&queue);
    queue_3.m_tail =
         density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
         start_consume_impl(&queue_1);
    queue_3.m_head = (ControlBlock *)&queue_1;
    if (queue_3.m_tail != (ControlBlock *)0x0) {
      prVar6 = density::
               heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
               reentrant_consume_operation::complete_type((reentrant_consume_operation *)&queue_3);
      if (prVar6->m_feature_table ==
          (tuple_type *)
          density::detail::
          FeatureTable<std::tuple<density::f_size,density::f_alignment,density::f_copy_construct,density::f_move_construct,density::f_rtti,density::f_destroy>,std::__cxx11::string>
          ::s_table) {
        density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
        reentrant_put_transaction<int>::commit((reentrant_put_transaction<int> *)&my_string);
        queue_2.m_tail =
             density::
             heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
             start_consume_impl(&queue_1);
        queue_2.m_head = (ControlBlock *)&queue_1;
        if (queue_2.m_tail != (ControlBlock *)0x0) {
          prVar6 = density::
                   heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
                   ::reentrant_consume_operation::complete_type
                             ((reentrant_consume_operation *)&queue_2);
          if (prVar6->m_feature_table ==
              (tuple_type *)
              density::detail::
              FeatureTable<std::tuple<density::f_size,density::f_alignment,density::f_copy_construct,density::f_move_construct,density::f_rtti,density::f_destroy>,int>
              ::s_table) {
            density::
            heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
            reentrant_put_transaction<void>::cancel((reentrant_put_transaction<void> *)&consume);
            density::
            heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
            reentrant_consume_operation::commit((reentrant_consume_operation *)&queue_2);
            density::
            heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
            reentrant_consume_operation::commit((reentrant_consume_operation *)&queue_3);
            bVar3 = density::
                    heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
                    ::empty(&queue_1);
            if (!bVar3) {
              __assert_fail("queue.empty()",
                            "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/heter_queue_examples.cpp"
                            ,0x6a0,"void density_tests::heterogeneous_queue_samples(std::ostream &)"
                           );
            }
            density::
            heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
            reentrant_consume_operation::~reentrant_consume_operation
                      ((reentrant_consume_operation *)&queue_2);
            density::
            heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
            reentrant_consume_operation::~reentrant_consume_operation
                      ((reentrant_consume_operation *)&queue_3);
            density::
            heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
            reentrant_put_transaction<void>::~reentrant_put_transaction
                      ((reentrant_put_transaction<void> *)&consume);
            density::
            heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
            reentrant_put_transaction<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::~reentrant_put_transaction
                      ((reentrant_put_transaction<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&queue);
            density::
            heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
            reentrant_put_transaction<int>::~reentrant_put_transaction
                      ((reentrant_put_transaction<int> *)&my_string);
            density::
            heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
            destroy(&queue_1);
            my_string._M_dataplus._M_p = (pointer)0xffef;
            my_string._M_string_length = 0xffef;
            queue.m_head = (ControlBlock *)CONCAT44(queue.m_head._4_4_,1);
            density::heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>>
            ::emplace<int,int>((heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>>
                                *)&my_string,(int *)&queue);
            queue.m_head = (ControlBlock *)CONCAT44(queue.m_head._4_4_,2);
            density::heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>>
            ::emplace<int,int>((heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>>
                                *)&my_string,(int *)&queue);
            density::
            heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
            reentrant_pop((heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
                           *)&my_string);
            queue.m_tail = density::
                           heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
                           ::start_consume_impl
                                     ((heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
                                       *)&my_string);
            queue.m_head = (ControlBlock *)&my_string;
            piVar12 = density::
                      heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
                      ::consume_operation::element<int>((consume_operation *)&queue);
            if (*piVar12 != 2) {
              __assert_fail("consume.element<int>() == 2",
                            "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/heter_queue_examples.cpp"
                            ,0x6ac,"void density_tests::heterogeneous_queue_samples(std::ostream &)"
                           );
            }
            density::
            heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
            consume_operation::commit((consume_operation *)&queue);
            density::
            heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
            consume_operation::~consume_operation((consume_operation *)&queue);
            density::
            heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
            destroy((heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
                     *)&my_string);
            my_string._M_dataplus._M_p = (pointer)0xffef;
            my_string._M_string_length = 0xffef;
            bVar3 = density::
                    heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
                    ::try_reentrant_pop((heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
                                         *)&my_string);
            if (bVar3) {
              __assert_fail("pop_result == false",
                            "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/heter_queue_examples.cpp"
                            ,0x6b5,"void density_tests::heterogeneous_queue_samples(std::ostream &)"
                           );
            }
            queue.m_head = (ControlBlock *)CONCAT44(queue.m_head._4_4_,1);
            density::heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>>
            ::emplace<int,int>((heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>>
                                *)&my_string,(int *)&queue);
            queue.m_head = (ControlBlock *)CONCAT44(queue.m_head._4_4_,2);
            density::heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>>
            ::emplace<int,int>((heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>>
                                *)&my_string,(int *)&queue);
            bVar3 = density::
                    heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
                    ::try_reentrant_pop((heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
                                         *)&my_string);
            if (!bVar3) {
              __assert_fail("pop_result == true",
                            "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/heter_queue_examples.cpp"
                            ,0x6bb,"void density_tests::heterogeneous_queue_samples(std::ostream &)"
                           );
            }
            queue.m_tail = density::
                           heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
                           ::start_consume_impl
                                     ((heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
                                       *)&my_string);
            queue.m_head = (ControlBlock *)&my_string;
            piVar12 = density::
                      heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
                      ::reentrant_consume_operation::element<int>
                                ((reentrant_consume_operation *)&queue);
            if (*piVar12 != 2) {
              __assert_fail("consume.element<int>() == 2",
                            "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/heter_queue_examples.cpp"
                            ,0x6bd,"void density_tests::heterogeneous_queue_samples(std::ostream &)"
                           );
            }
            density::
            heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
            reentrant_consume_operation::commit((reentrant_consume_operation *)&queue);
            density::
            heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
            reentrant_consume_operation::~reentrant_consume_operation
                      ((reentrant_consume_operation *)&queue);
            density::
            heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
            destroy((heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
                     *)&my_string);
            my_string._M_dataplus._M_p = (pointer)0xffef;
            my_string._M_string_length = 0xffef;
            queue.m_tail = density::
                           heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
                           ::start_consume_impl
                                     ((heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
                                       *)&my_string);
            queue.m_head = (ControlBlock *)&my_string;
            if (queue.m_tail != (ControlBlock *)0x0) {
              __assert_fail("!consume_1",
                            "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/heter_queue_examples.cpp"
                            ,0x6c7,"void density_tests::heterogeneous_queue_samples(std::ostream &)"
                           );
            }
            consume.m_queue =
                 (heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *
                 )CONCAT44(consume.m_queue._4_4_,0x2a);
            density::heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>>
            ::emplace<int,int>((heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>>
                                *)&my_string,(int *)&consume);
            consume.m_control =
                 density::
                 heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
                 start_consume_impl((heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
                                     *)&my_string);
            consume.m_queue =
                 (heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *
                 )&my_string;
            if (consume.m_control == (ControlBlock *)0x0) {
              __assert_fail("consume_2",
                            "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/heter_queue_examples.cpp"
                            ,0x6cc,"void density_tests::heterogeneous_queue_samples(std::ostream &)"
                           );
            }
            piVar12 = density::
                      heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
                      ::reentrant_consume_operation::element<int>
                                ((reentrant_consume_operation *)&consume);
            if (*piVar12 == 0x2a) {
              density::
              heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
              reentrant_consume_operation::commit((reentrant_consume_operation *)&consume);
              density::
              heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
              reentrant_consume_operation::~reentrant_consume_operation
                        ((reentrant_consume_operation *)&consume);
              density::
              heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
              reentrant_consume_operation::~reentrant_consume_operation
                        ((reentrant_consume_operation *)&queue);
              density::
              heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
              destroy((heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
                       *)&my_string);
              my_string._M_dataplus._M_p = (pointer)0xffef;
              my_string._M_string_length = 0xffef;
              queue.m_tail = (ControlBlock *)0x0;
              bVar3 = density::
                      heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
                      ::try_start_reentrant_consume
                                ((heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
                                  *)&my_string,(reentrant_consume_operation *)&queue);
              if ((bVar3) || (queue.m_tail != (ControlBlock *)0x0)) {
                __assert_fail("!bool_1 && !consume_1",
                              "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/heter_queue_examples.cpp"
                              ,0x6d7,
                              "void density_tests::heterogeneous_queue_samples(std::ostream &)");
              }
              consume.m_queue =
                   (heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
                    *)CONCAT44(consume.m_queue._4_4_,0x2a);
              density::
              heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>>::
              emplace<int,int>((heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>>
                                *)&my_string,(int *)&consume);
              consume.m_control = (ControlBlock *)0x0;
              bVar3 = density::
                      heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
                      ::try_start_reentrant_consume
                                ((heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
                                  *)&my_string,(reentrant_consume_operation *)&consume);
              if ((bVar3) && (consume.m_control != (ControlBlock *)0x0)) {
                piVar12 = density::
                          heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
                          ::reentrant_consume_operation::element<int>
                                    ((reentrant_consume_operation *)&consume);
                if (*piVar12 == 0x2a) {
                  density::
                  heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
                  reentrant_consume_operation::commit((reentrant_consume_operation *)&consume);
                  density::
                  heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
                  reentrant_consume_operation::~reentrant_consume_operation
                            ((reentrant_consume_operation *)&consume);
                  density::
                  heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
                  reentrant_consume_operation::~reentrant_consume_operation
                            ((reentrant_consume_operation *)&queue);
                  density::
                  heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
                  destroy((heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
                           *)&my_string);
                  heterogeneous_queue_put_samples();
                  heterogeneous_queue_put_transaction_samples();
                  heterogeneous_queue_consume_operation_samples();
                  heterogeneous_queue_reentrant_put_samples();
                  heterogeneous_queue_reentrant_put_transaction_samples();
                  heterogeneous_queue_reentrant_consume_operation_samples();
                  PrintScopeDuration::~PrintScopeDuration(&dur);
                  return;
                }
                __assert_fail("consume_2.element<int>() == 42",
                              "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/heter_queue_examples.cpp"
                              ,0x6de,
                              "void density_tests::heterogeneous_queue_samples(std::ostream &)");
              }
              __assert_fail("consume_2 && bool_2",
                            "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/heter_queue_examples.cpp"
                            ,0x6dd,"void density_tests::heterogeneous_queue_samples(std::ostream &)"
                           );
            }
            __assert_fail("consume_2.element<int>() == 42",
                          "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/heter_queue_examples.cpp"
                          ,0x6cd,"void density_tests::heterogeneous_queue_samples(std::ostream &)");
          }
        }
        __assert_fail("!consume1.empty() && consume1.complete_type().is<int>()",
                      "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/heter_queue_examples.cpp"
                      ,0x69a,"void density_tests::heterogeneous_queue_samples(std::ostream &)");
      }
    }
    __assert_fail("!consume2.empty() && consume2.complete_type().is<std::string>()",
                  "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/heter_queue_examples.cpp"
                  ,0x695,"void density_tests::heterogeneous_queue_samples(std::ostream &)");
  }
  __assert_fail("std::distance(queue_1.begin(), queue_1.end()) == 1",
                "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/heter_queue_examples.cpp"
                ,0x632,"void density_tests::heterogeneous_queue_samples(std::ostream &)");
}

Assistant:

void heterogeneous_queue_samples(std::ostream & i_ostream)
    {
        PrintScopeDuration dur(i_ostream, "heterogeneous queue samples");

        using namespace density;

        {
            //! [heter_queue put example 1]
            heter_queue<> queue;
            queue.push(19);                     // the parameter can be an l-value or an r-value
            queue.emplace<std::string>(8, '*'); // pushes "********"
            //! [heter_queue put example 1]

            //! [heter_queue example 2]
            auto consume = queue.try_start_consume();
            int  my_int  = consume.element<int>();
            consume.commit();

            consume               = queue.try_start_consume();
            std::string my_string = consume.element<std::string>();
            consume.commit();
            //! [heter_queue example 3
            (void)my_int;
            (void)my_string;
        }

        {
            //! [heter_queue put example 2]
            heter_queue<> queue;
            struct MessageInABottle
            {
                const char * m_text = nullptr;
            };
            auto transaction             = queue.start_emplace<MessageInABottle>();
            transaction.element().m_text = transaction.raw_allocate_copy("Hello world!");
            transaction.commit();
            //! [heter_queue put example 2]

            //! [heter_queue consume example 1]
            auto consume = queue.try_start_consume();
            if (consume.complete_type().is<std::string>())
            {
                std::cout << consume.element<std::string>() << std::endl;
            }
            else if (consume.complete_type().is<MessageInABottle>())
            {
                std::cout << consume.element<MessageInABottle>().m_text << std::endl;
            }
            consume.commit();
            //! [heter_queue consume example 1]

            //! [heter_queue iterators example 1]
            heter_queue<> queue_1, queue_2;
            queue_1.push(42);
            assert(queue_1.end() == queue_2.end() && queue_1.end() == heter_queue<>::iterator());

            for (const auto & value : queue_1)
            {
                assert(value.as<int>() == 42);
            }
            //! [heter_queue iterators example 1]
        }

        {
            //! [heter_queue default_construct example 1]
            heter_queue<> queue;
            assert(queue.empty());
            assert(std::distance(queue.begin(), queue.end()) == 0);
            assert(queue.cbegin() == queue.cend());
            //! [heter_queue default_construct example 1]
        }
        {
            //! [heter_queue copy_construct example 1]
            using MyRunTimeType = runtime_type<
              f_default_construct,
              f_copy_construct,
              f_destroy,
              f_size,
              f_alignment,
              f_equal>;

            heter_queue<MyRunTimeType> queue;
            queue.push(std::string());
            queue.push(std::make_pair(4., 1));

            heter_queue<MyRunTimeType> queue_1(queue);
            assert(queue == queue_1);
            //! [heter_queue copy_construct example 1]
        }
        {
            //! [heter_queue move_construct example 1]
            using MyRunTimeType = runtime_type<
              f_default_construct,
              f_copy_construct,
              f_destroy,
              f_size,
              f_alignment,
              f_equal>;

            heter_queue<MyRunTimeType> queue;
            queue.push(std::string());
            queue.push(std::make_pair(4., 1));

            heter_queue<MyRunTimeType> queue_1(std::move(queue));

            assert(queue.empty());
            assert(std::distance(queue.begin(), queue.end()) == 0);
            assert(queue.cbegin() == queue.cend());

            assert(!queue_1.empty());
            assert(std::distance(queue_1.begin(), queue_1.end()) == 2);
            assert(queue_1.cbegin() != queue_1.cend());
            //! [heter_queue move_construct example 1]
        }
        {
            //! [heter_queue construct_copy_alloc example 1]
            default_allocator allocator;
            heter_queue<>     queue(allocator);
            assert(queue.empty());
            //! [heter_queue construct_copy_alloc example 1]
        }
        {
            //! [heter_queue construct_move_alloc example 1]
            default_allocator allocator;
            heter_queue<>     queue(std::move(allocator));
            assert(queue.empty());
            //! [heter_queue construct_move_alloc example 1]
        }
        {
            //! [heter_queue copy_assign example 1]
            using MyRunTimeType = runtime_type<
              f_default_construct,
              f_copy_construct,
              f_destroy,
              f_size,
              f_alignment,
              f_equal>;

            heter_queue<MyRunTimeType> queue;
            queue.push(std::string());
            queue.push(std::make_pair(4., 1));

            heter_queue<MyRunTimeType> queue_1;
            queue_1 = queue;
            assert(queue == queue_1);
            //! [heter_queue copy_assign example 1]
        }
        {
            //! [heter_queue move_assign example 1]
            using MyRunTimeType = runtime_type<
              f_default_construct,
              f_copy_construct,
              f_destroy,
              f_size,
              f_alignment,
              f_equal>;

            heter_queue<MyRunTimeType> queue;
            queue.push(std::string());
            queue.push(std::make_pair(4., 1));

            heter_queue<MyRunTimeType> queue_1;
            queue_1 = std::move(queue);

            assert(queue.empty());
            assert(std::distance(queue.begin(), queue.end()) == 0);
            assert(queue.cbegin() == queue.cend());

            assert(!queue_1.empty());
            assert(std::distance(queue_1.begin(), queue_1.end()) == 2);
            assert(queue_1.cbegin() != queue_1.cend());
            //! [heter_queue move_assign example 1]
        }
        {
            //! [heter_queue get_allocator example 1]
            heter_queue<> queue;
            assert(queue.get_allocator() == default_allocator());
            //! [heter_queue get_allocator example 1]
        }
        {
            //! [heter_queue get_allocator_ref example 1]
            heter_queue<> queue;
            assert(queue.get_allocator_ref() == default_allocator());
            //! [heter_queue get_allocator_ref example 1]
        }
        {
            //! [heter_queue get_allocator_ref example 2]
            heter_queue<> queue;
            auto const &  queue_ref = queue;
            assert(queue_ref.get_allocator_ref() == default_allocator());
            //! [heter_queue get_allocator_ref example 2]
            (void)queue_ref;
        }
        {
            //! [heter_queue swap example 1]
            heter_queue<> queue, queue_1;
            queue.push(1);
            swap(queue, queue_1);

            assert(queue.empty());
            assert(std::distance(queue.begin(), queue.end()) == 0);
            assert(queue.cbegin() == queue.cend());

            assert(!queue_1.empty());
            assert(std::distance(queue_1.begin(), queue_1.end()) == 1);
            assert(queue_1.cbegin() != queue_1.cend());
            //! [heter_queue swap example 1]
        }
        {
            //! [heter_queue swap example 2]
            heter_queue<> queue, queue_1;
            queue.push(1);
            {
                using namespace std;
                swap(queue, queue_1);
            }
            assert(queue.empty());
            assert(std::distance(queue.begin(), queue.end()) == 0);
            assert(queue.cbegin() == queue.cend());

            assert(!queue_1.empty());
            assert(std::distance(queue_1.begin(), queue_1.end()) == 1);
            assert(queue_1.cbegin() != queue_1.cend());
            //! [heter_queue swap example 2]
        }
        {
            //! [heter_queue empty example 1]
            heter_queue<> queue;
            assert(queue.empty());
            queue.push(1);
            assert(!queue.empty());
            //! [heter_queue empty example 1]
        }
        {
            //! [heter_queue clear example 1]
            heter_queue<> queue;
            queue.push(1);
            queue.clear();
            assert(queue.empty());
            //! [heter_queue clear example 1]
        }
        {
            //! [heter_queue pop example 1]
            heter_queue<> queue;
            queue.push(1);
            queue.push(2);

            queue.pop();
            auto consume = queue.try_start_consume();
            assert(consume.element<int>() == 2);
            consume.commit();
            //! [heter_queue pop example 1]
        }
        {
            //! [heter_queue try_pop example 1]
            heter_queue<> queue;

            bool pop_result = queue.try_pop();
            assert(pop_result == false);

            queue.push(1);
            queue.push(2);

            pop_result = queue.try_pop();
            assert(pop_result == true);
            auto consume = queue.try_start_consume();
            assert(consume.element<int>() == 2);
            consume.commit();
            //! [heter_queue try_pop example 1]
            (void)pop_result;
        }
        {
            //! [heter_queue try_start_consume example 1]
            heter_queue<> queue;

            auto consume_1 = queue.try_start_consume();
            assert(!consume_1);

            queue.push(42);

            auto consume_2 = queue.try_start_consume();
            assert(consume_2);
            assert(consume_2.element<int>() == 42);
            consume_2.commit();
            //! [heter_queue try_start_consume example 1]
        }
        {
            //! [heter_queue try_start_consume_ example 1]
            heter_queue<> queue;

            heter_queue<>::consume_operation consume_1;
            bool const                       bool_1 = queue.try_start_consume(consume_1);
            assert(!bool_1 && !consume_1);

            queue.push(42);

            heter_queue<>::consume_operation consume_2;
            auto                             bool_2 = queue.try_start_consume(consume_2);
            assert(consume_2 && bool_2);
            assert(consume_2.element<int>() == 42);
            consume_2.commit();
            //! [heter_queue try_start_consume_ example 1]
            (void)bool_1;
            (void)bool_2;
        }
        {
            heter_queue<> queue;

            //! [heter_queue reentrant example 1]
            // start 3 reentrant put transactions
            auto   put_1 = queue.start_reentrant_push(1);
            auto   put_2 = queue.start_reentrant_emplace<std::string>("Hello world!");
            double pi    = 3.14;
            auto   put_3 = queue.start_reentrant_dyn_push_copy(runtime_type<>::make<double>(), &pi);
            assert(
              queue.empty()); // the queue is still empty, because no transaction has been committed

            // commit and start consuming "Hello world!"
            put_2.commit();
            auto consume2 = queue.try_start_reentrant_consume();
            assert(!consume2.empty() && consume2.complete_type().is<std::string>());

            // commit and start consuming 1
            put_1.commit();
            auto consume1 = queue.try_start_reentrant_consume();
            assert(!consume1.empty() && consume1.complete_type().is<int>());

            // cancel 3.14, and commit the consumes
            put_3.cancel();
            consume1.commit();
            consume2.commit();
            assert(queue.empty());

            //! [heter_queue reentrant example 1]
        }
        {
            //! [heter_queue reentrant_pop example 1]
            heter_queue<> queue;
            queue.push(1);
            queue.push(2);

            queue.reentrant_pop();
            auto consume = queue.try_start_consume();
            assert(consume.element<int>() == 2);
            consume.commit();
            //! [heter_queue reentrant_pop example 1]
        }
        {
            //! [heter_queue try_reentrant_pop example 1]
            heter_queue<> queue;

            bool pop_result = queue.try_reentrant_pop();
            assert(pop_result == false);

            queue.push(1);
            queue.push(2);

            pop_result = queue.try_reentrant_pop();
            assert(pop_result == true);
            auto consume = queue.try_start_reentrant_consume();
            assert(consume.element<int>() == 2);
            consume.commit();
            //! [heter_queue try_reentrant_pop example 1]
            (void)pop_result;
        }
        {
            //! [heter_queue try_start_reentrant_consume example 1]
            heter_queue<> queue;

            auto consume_1 = queue.try_start_reentrant_consume();
            assert(!consume_1);

            queue.push(42);

            auto consume_2 = queue.try_start_reentrant_consume();
            assert(consume_2);
            assert(consume_2.element<int>() == 42);
            consume_2.commit();
            //! [heter_queue try_start_reentrant_consume example 1]
        }
        {
            //! [heter_queue try_start_reentrant_consume_ example 1]
            heter_queue<> queue;

            heter_queue<>::reentrant_consume_operation consume_1;
            bool const bool_1 = queue.try_start_reentrant_consume(consume_1);
            assert(!bool_1 && !consume_1);

            queue.push(42);

            heter_queue<>::reentrant_consume_operation consume_2;
            auto bool_2 = queue.try_start_reentrant_consume(consume_2);
            assert(consume_2 && bool_2);
            assert(consume_2.element<int>() == 42);
            consume_2.commit();
            //! [heter_queue try_start_reentrant_consume_ example 1]
            (void)bool_1;
            (void)bool_2;
        }

        // this samples uses std::cout and std::cin
        // heterogeneous_queue_samples_1();

        heterogeneous_queue_put_samples();

        heterogeneous_queue_put_transaction_samples();

        heterogeneous_queue_consume_operation_samples();

        heterogeneous_queue_reentrant_put_samples();

        heterogeneous_queue_reentrant_put_transaction_samples();

        heterogeneous_queue_reentrant_consume_operation_samples();
    }